

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * String::fromBase64(String *__return_storage_ptr__,String *data)

{
  usize *puVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  usize copyLength;
  ulong uVar7;
  char cVar8;
  String result;
  String local_50;
  
  local_50.data = &emptyData.super_Data;
  uVar4 = data->data->len;
  if ((uVar4 & 3) == 0) {
    uVar7 = uVar4;
    if (uVar4 < emptyData.super_Data.len) {
      uVar7 = emptyData.super_Data.len;
    }
    detach(&local_50,emptyData.super_Data.len,uVar7);
    detach(&local_50,(local_50.data)->len,(local_50.data)->len);
    pcVar5 = ((Data *)&(local_50.data)->str)->str;
    pcVar6 = operator_cast_to_char_(data);
    copyLength = 0;
    if (uVar4 != 0) {
      uVar7 = 0;
      do {
        bVar2 = pcVar6[uVar7];
        if ('z' < (char)bVar2) goto LAB_00106863;
        bVar3 = (&DAT_001085b0)[bVar2];
        if (bVar3 == 0xff) {
          if (bVar2 != 0x3d) goto LAB_00106863;
          break;
        }
        switch((uint)uVar7 & 3) {
        case 0:
          pcVar5[copyLength] = bVar3 << 2;
          break;
        case 1:
          pcVar5[copyLength] = pcVar5[copyLength] | bVar3 >> 4 & 3;
          cVar8 = bVar3 << 4;
          goto LAB_0010692d;
        case 2:
          pcVar5[copyLength] = pcVar5[copyLength] | bVar3 >> 2 & 0xf;
          cVar8 = bVar3 << 6;
LAB_0010692d:
          pcVar5[copyLength + 1] = cVar8;
          copyLength = copyLength + 1;
          break;
        case 3:
          pcVar5[copyLength] = pcVar5[copyLength] | bVar3;
          copyLength = copyLength + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    detach(&local_50,copyLength,copyLength);
    String(__return_storage_ptr__,&local_50);
  }
  else {
LAB_00106863:
    __return_storage_ptr__->data = &emptyData.super_Data;
  }
  if ((local_50.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_50.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_50.data != (Data *)0x0)) {
      operator_delete__(local_50.data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String String::fromBase64(const String& data)
{
    String result;
    usize inlen = data.length();
    if (inlen & 0x3)
        return String();
    result.reserve(data.length());
    char* out = (char*)result;
    const char* in = (const char*)data;
    usize i;
    usize j;
    unsigned char c;
    const unsigned char base64de[] = {
        /* nul, soh, stx, etx, eot, enq, ack, bel, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /*  bs,  ht,  nl,  vt,  np,  cr,  so,  si, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /* dle, dc1, dc2, dc3, dc4, nak, syn, etb, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /* can,  em, sub, esc,  fs,  gs,  rs,  us, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /*  sp, '!', '"', '#', '$', '%', '&', ''', */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /* '(', ')', '*', '+', ',', '-', '.', '/', */
           255, 255, 255,  62, 255, 255, 255,  63,
    
        /* '0', '1', '2', '3', '4', '5', '6', '7', */
            52,  53,  54,  55,  56,  57,  58,  59,
    
        /* '8', '9', ':', ';', '<', '=', '>', '?', */
            60,  61, 255, 255, 255, 255, 255, 255,
    
        /* '@', 'A', 'B', 'C', 'D', 'E', 'F', 'G', */
           255,   0,   1,  2,   3,   4,   5,    6,
    
        /* 'H', 'I', 'J', 'K', 'L', 'M', 'N', 'O', */
             7,   8,   9,  10,  11,  12,  13,  14,
    
        /* 'P', 'Q', 'R', 'S', 'T', 'U', 'V', 'W', */
            15,  16,  17,  18,  19,  20,  21,  22,
    
        /* 'X', 'Y', 'Z', '[', '\', ']', '^', '_', */
            23,  24,  25, 255, 255, 255, 255, 255,
    
        /* '`', 'a', 'b', 'c', 'd', 'e', 'f', 'g', */
           255,  26,  27,  28,  29,  30,  31,  32,
    
        /* 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', */
            33,  34,  35,  36,  37,  38,  39,  40,
    
        /* 'p', 'q', 'r', 's', 't', 'u', 'v', 'w', */
            41,  42,  43,  44,  45,  46,  47,  48,
    
        /* 'x', 'y', 'z', '{', '|', '}', '~', del, */
            49,  50,  51//, 255, 255, 255, 255, 255
    };
    for (i = j = 0; i < inlen; ++i)
    {
        if (in[i] > 'z') 
            return String();

        c = base64de[(unsigned char)in[i]];
        if (c == 255)
        {
            if (in[i] == '=')
                break;

            return String();
        }

        switch (i & 0x3)
        {
        case 0:
            out[j] = (c << 2) & 0xFF;
            break;
        case 1:
            out[j++] |= (c >> 4) & 0x3;
            out[j] = (c & 0xF) << 4; 
            break;
        case 2:
            out[j++] |= (c >> 2) & 0xF;
            out[j] = (c & 0x3) << 6;
            break;
        case 3:
            out[j++] |= c;
            break;
        }
    }
    result.resize(j);
    return result;
}